

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

void __thiscall QDirSortItem::~QDirSortItem(QDirSortItem *this)

{
  QFileInfo::~QFileInfo((QFileInfo *)0x28ad10);
  QString::~QString((QString *)0x28ad1e);
  QString::~QString((QString *)0x28ad28);
  return;
}

Assistant:

QDirSortItem(const QFileInfo &fi, QDir::SortFlags sort)
        : item(fi)
    {
        // A dir e.g. "dirA.bar" doesn't have actually have an extension/suffix, when
        // sorting by type such "suffix" should be ignored but that would complicate
        // the code and uses can change the behavior by setting DirsFirst/DirsLast
        if (sort.testAnyFlag(QDir::Type))
            suffix_cache = item.suffix();
    }